

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::GenerateCTestNotesOutput
          (cmCTest *this,cmXMLWriter *xml,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  pointer pbVar1;
  bool bVar2;
  char *__rhs;
  ostream *poVar3;
  pointer value;
  string note_time;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string buildname;
  ostringstream cmCTestLog_msg_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [22];
  ifstream ifs;
  byte abStack_218 [488];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_1,"BuildName",(allocator<char> *)&note_time);
  GetCTestConfiguration((string *)&ifs,this,(string *)&cmCTestLog_msg_1);
  SafeBuildIdField(&buildname,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  cmXMLWriter::StartDocument(xml,"UTF-8");
  cmXMLWriter::ProcessingInstruction
            (xml,"xml-stylesheet",
             "type=\"text/xsl\" href=\"Dart/Source/Server/XSL/Build.xsl <file:///Dart/Source/Server/XSL/Build.xsl> \""
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ifs,"Site",(allocator<char> *)&cmCTestLog_msg_1);
  cmXMLWriter::StartElement(xml,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"BuildName",&buildname);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCTestLog_msg_1,
                 &((this->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->CurrentTag,"-");
  GetTestModelString_abi_cxx11_(&note_time,this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCTestLog_msg_1,&note_time);
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xml,"BuildStamp",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::~string((string *)&note_time);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_1,"Site",(allocator<char> *)&note_time);
  GetCTestConfiguration((string *)&ifs,this,(string *)&cmCTestLog_msg_1);
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xml,"Name",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_1,"ctest-",(allocator<char> *)&note_time);
  __rhs = cmVersion::GetCMakeVersion();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCTestLog_msg_1,__rhs);
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xml,"Generator",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  AddSiteProperties(this,xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ifs,"Notes",(allocator<char> *)&cmCTestLog_msg_1);
  cmXMLWriter::StartElement(xml,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  pbVar1 = (files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (value = (files->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; value != pbVar1; value = value + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    poVar3 = std::operator<<((ostream *)&ifs,"\tAdd file: ");
    poVar3 = std::operator<<(poVar3,(string *)value);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x603,_cmCTestLog_msg_1,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
    CurrentTime_abi_cxx11_(&note_time,this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ifs,"Note",(allocator<char> *)&cmCTestLog_msg_1);
    cmXMLWriter::StartElement(xml,(string *)&ifs);
    std::__cxx11::string::~string((string *)&ifs);
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Name",value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ifs,"Time",(allocator<char> *)&local_3f0);
    _cmCTestLog_msg_1 = (pointer)std::chrono::_V2::system_clock::now();
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (xml,(string *)&ifs,
               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&cmCTestLog_msg_1);
    std::__cxx11::string::~string((string *)&ifs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ifs,"DateTime",(allocator<char> *)&cmCTestLog_msg_1);
    cmXMLWriter::Element<std::__cxx11::string>(xml,(string *)&ifs,&note_time);
    std::__cxx11::string::~string((string *)&ifs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ifs,"Text",(allocator<char> *)&cmCTestLog_msg_1);
    cmXMLWriter::StartElement(xml,(string *)&ifs);
    std::__cxx11::string::~string((string *)&ifs);
    std::ifstream::ifstream((string *)&ifs,(value->_M_dataplus)._M_p,_S_in);
    if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0) {
      _cmCTestLog_msg_1 = (pointer)local_3a0;
      local_3a0[0]._M_local_buf[0] = '\0';
      while( true ) {
        bVar2 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&ifs,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cmCTestLog_msg_1,(bool *)0x0,0xffffffffffffffff);
        if (!bVar2) break;
        cmXMLWriter::Content<std::__cxx11::string>
                  (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCTestLog_msg_1);
        cmXMLWriter::Content<char[2]>(xml,(char (*) [2])0x647ff5);
      }
      std::ifstream::close();
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    }
    else {
      std::operator+(&local_3f0,"Problem reading file: ",value);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg_1,&local_3f0,"\n");
      cmXMLWriter::Content<std::__cxx11::string>
                (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg_1);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg_1,"Problem reading file: ");
      poVar3 = std::operator<<(poVar3,(string *)value);
      poVar3 = std::operator<<(poVar3," while creating notes");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::stringbuf::str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x616,local_3f0._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
    }
    cmXMLWriter::EndElement(xml);
    cmXMLWriter::EndElement(xml);
    std::ifstream::~ifstream((string *)&ifs);
    std::__cxx11::string::~string((string *)&note_time);
  }
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndDocument(xml);
  std::__cxx11::string::~string((string *)&buildname);
  return 1;
}

Assistant:

int cmCTest::GenerateCTestNotesOutput(cmXMLWriter& xml,
                                      std::vector<std::string> const& files)
{
  std::string buildname =
    cmCTest::SafeBuildIdField(this->GetCTestConfiguration("BuildName"));
  xml.StartDocument();
  xml.ProcessingInstruction("xml-stylesheet",
                            "type=\"text/xsl\" "
                            "href=\"Dart/Source/Server/XSL/Build.xsl "
                            "<file:///Dart/Source/Server/XSL/Build.xsl> \"");
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.Attribute("BuildStamp",
                this->Impl->CurrentTag + "-" + this->GetTestModelString());
  xml.Attribute("Name", this->GetCTestConfiguration("Site"));
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  this->AddSiteProperties(xml);
  xml.StartElement("Notes");

  for (std::string const& file : files) {
    cmCTestLog(this, OUTPUT, "\tAdd file: " << file << std::endl);
    std::string note_time = this->CurrentTime();
    xml.StartElement("Note");
    xml.Attribute("Name", file);
    xml.Element("Time", std::chrono::system_clock::now());
    xml.Element("DateTime", note_time);
    xml.StartElement("Text");
    cmsys::ifstream ifs(file.c_str());
    if (ifs) {
      std::string line;
      while (cmSystemTools::GetLineFromStream(ifs, line)) {
        xml.Content(line);
        xml.Content("\n");
      }
      ifs.close();
    } else {
      xml.Content("Problem reading file: " + file + "\n");
      cmCTestLog(this, ERROR_MESSAGE,
                 "Problem reading file: " << file << " while creating notes"
                                          << std::endl);
    }
    xml.EndElement(); // Text
    xml.EndElement(); // Note
  }
  xml.EndElement(); // Notes
  xml.EndElement(); // Site
  xml.EndDocument();
  return 1;
}